

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

bool cppwinrt::write_structs
               (writer *w,
               vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *types)

{
  char **args;
  size_t sVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference right_00;
  reference this;
  long lVar6;
  char *__str;
  string_view sVar7;
  string_view local_1d0;
  string_view local_1c0;
  reference local_1b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  anon_class_8_1_898e5d9c_conflict local_188;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  undefined1 local_170 [8];
  string_view is_noexcept;
  string_view name;
  complex_struct *type_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<complex_struct,_std::allocator<complex_struct>_> *__range1_1;
  undefined1 local_120 [8];
  string cpp_namespace;
  bool promote;
  __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
  local_f0;
  __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
  local_e8;
  const_iterator local_e0;
  complex_struct *local_d8;
  __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
  local_d0;
  __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
  local_c8;
  const_iterator local_c0;
  undefined1 local_b8 [8];
  complex_struct temp;
  size_t right;
  size_t left;
  reference pTStack_70;
  anon_class_1_0_00000001 depends;
  TypeDef *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *__range1;
  undefined1 local_40 [8];
  vector<complex_struct,_std::allocator<complex_struct>_> structs;
  char *format;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *types_local;
  writer *w_local;
  
  structs.super__Vector_base<complex_struct,_std::allocator<complex_struct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9cf9f;
  bVar3 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::empty(types)
  ;
  if (bVar3) {
    w_local._7_1_ = false;
  }
  else {
    std::vector<complex_struct,_std::allocator<complex_struct>_>::vector
              ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
    sVar4 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::size
                      (types);
    std::vector<complex_struct,_std::allocator<complex_struct>_>::reserve
              ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,sVar4);
    __end1 = std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::begin
                       (types);
    type = (TypeDef *)
           std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::end(types);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                                       *)&type), bVar3) {
      pTStack_70 = __gnu_cxx::
                   __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
                   ::operator*(&__end1);
      ::std::
      vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>
      ::emplace_back<cppwinrt::writer&,winmd::reader::TypeDef_const&>
                ((vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>
                  *)local_40,w,pTStack_70);
      __gnu_cxx::
      __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
      ::operator++(&__end1);
    }
    for (right = 0;
        sVar4 = std::vector<complex_struct,_std::allocator<complex_struct>_>::size
                          ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40),
        sVar1 = right, right < sVar4; right = right + 1) {
      while( true ) {
        temp._40_8_ = sVar1 + 1;
        uVar2 = temp._40_8_;
        sVar4 = std::vector<complex_struct,_std::allocator<complex_struct>_>::size
                          ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
        if (sVar4 <= (ulong)uVar2) break;
        pvVar5 = std::vector<complex_struct,_std::allocator<complex_struct>_>::operator[]
                           ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,
                            right);
        right_00 = std::vector<complex_struct,_std::allocator<complex_struct>_>::operator[]
                             ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,
                              temp._40_8_);
        bVar3 = write_structs::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&left + 7),w,pvVar5,right_00);
        sVar1 = temp._40_8_;
        if (bVar3) {
          pvVar5 = std::vector<complex_struct,_std::allocator<complex_struct>_>::operator[]
                             ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,
                              temp._40_8_);
          write_structs::complex_struct::complex_struct((complex_struct *)local_b8,pvVar5);
          local_d0._M_current =
               (complex_struct *)
               std::vector<complex_struct,_std::allocator<complex_struct>_>::begin
                         ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
          local_c8 = __gnu_cxx::
                     __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
                     ::operator+(&local_d0,temp._40_8_);
          __gnu_cxx::
          __normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct_const*,std::vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>>
          ::
          __normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct*>
                    ((__normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct_const*,std::vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>>
                      *)&local_c0,&local_c8);
          local_d8 = (complex_struct *)
                     std::vector<complex_struct,_std::allocator<complex_struct>_>::erase
                               ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,
                                local_c0);
          local_f0._M_current =
               (complex_struct *)
               std::vector<complex_struct,_std::allocator<complex_struct>_>::begin
                         ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
          local_e8 = __gnu_cxx::
                     __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
                     ::operator+(&local_f0,right);
          __gnu_cxx::
          __normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct_const*,std::vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>>
          ::
          __normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct*>
                    ((__normal_iterator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct_const*,std::vector<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct,std::allocator<cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>const&)::complex_struct>>>
                      *)&local_e0,&local_e8);
          std::vector<complex_struct,_std::allocator<complex_struct>_>::insert
                    ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40,local_e0,
                     (value_type *)local_b8);
          temp._40_8_ = std::vector<complex_struct,_std::allocator<complex_struct>_>::size
                                  ((vector<complex_struct,_std::allocator<complex_struct>_> *)
                                   local_40);
          right = right - 1;
          write_structs::complex_struct::~complex_struct((complex_struct *)local_b8);
          sVar1 = temp._40_8_;
        }
      }
    }
    cpp_namespace.field_2._M_local_buf[0xf] = '\0';
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range1_1,"@");
    writer_base<cppwinrt::writer>::write_temp<std::__cxx11::string>
              ((string *)local_120,&w->super_writer_base<cppwinrt::writer>,
               (basic_string_view<char,_std::char_traits<char>_> *)&__range1_1,&w->type_namespace);
    __end1_1 = std::vector<complex_struct,_std::allocator<complex_struct>_>::begin
                         ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
    type_1 = (complex_struct *)
             std::vector<complex_struct,_std::allocator<complex_struct>_>::end
                       ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
                          *)&type_1);
      if (!bVar3) break;
      this = __gnu_cxx::
             __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
             ::operator*(&__end1_1);
      sVar7 = winmd::reader::TypeDef::TypeName(&this->type);
      is_noexcept._M_str = (char *)sVar7._M_len;
      __str = "";
      if ((this->is_noexcept & 1U) != 0) {
        __str = " noexcept";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_170,__str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_180,
                 (char *)structs.super__Vector_base<complex_struct,_std::allocator<complex_struct>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_188 = bind_each<&cppwinrt::write_struct_field,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            (&this->fields);
      __range2 = (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)bind<&cppwinrt::write_struct_equality,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&>
                              (&this->fields);
      args = &is_noexcept._M_str;
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                (&w->super_writer_base<cppwinrt::writer>,&local_180,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,&local_188,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_170,
                 (anon_class_8_1_89897ddb_conflict5 *)&__range2,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,
                 (basic_string_view<char,_std::char_traits<char>_> *)args,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_170);
      __end2 = std::
               vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&this->fields);
      field = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(&this->fields);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)&field);
        if (!bVar3) break;
        local_1b0 = __gnu_cxx::
                    __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&__end2);
        lVar6 = ::std::__cxx11::string::find((char)local_1b0 + '\x10',0x3a);
        if (lVar6 != -1) {
          sVar7 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&local_1b0->second);
          local_1c0 = sVar7;
          sVar7 = (string_view)
                  ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
          local_1d0 = sVar7;
          bVar3 = starts_with(&local_1c0,&local_1d0);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            cpp_namespace.field_2._M_local_buf[0xf] = '\x01';
          }
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<complex_struct_*,_std::vector<complex_struct,_std::allocator<complex_struct>_>_>
      ::operator++(&__end1_1);
    }
    w_local._7_1_ = (bool)(cpp_namespace.field_2._M_local_buf[0xf] & 1);
    ::std::__cxx11::string::~string((string *)local_120);
    std::vector<complex_struct,_std::allocator<complex_struct>_>::~vector
              ((vector<complex_struct,_std::allocator<complex_struct>_> *)local_40);
  }
  return w_local._7_1_;
}

Assistant:

static bool write_structs(writer& w, std::vector<TypeDef> const& types)
    {
        auto format = R"(    struct %
    {
%    };
    inline bool operator==(% const& left, % const& right)%
    {
        return%;
    }
    inline bool operator!=(% const& left, % const& right)%
    {
        return !(left == right);
    }
)";

        if (types.empty())
        {
            return false;
        }

        struct complex_struct
        {
            complex_struct(writer& w, TypeDef const& type) :
                type(type),
                is_noexcept(!has_reference(type))
            {
                for (auto&& field : type.FieldList())
                {
                    fields.emplace_back(field.Name(), w.write_temp("%", field.Signature().Type()));
                }
            }

            static bool has_reference(TypeDef const&)
            {
                return false;
            };

            TypeDef type;
            std::vector<std::pair<std::string_view, std::string>> fields;
            bool is_noexcept{ false };
        };

        std::vector<complex_struct> structs;
        structs.reserve(types.size());

        for (auto&& type : types)
        {
            structs.emplace_back(w, type);
        }

        auto depends = [](writer& w, complex_struct const& left, complex_struct const& right)
        {
            auto right_type = w.write_temp("%", right.type);
            std::string right_as_ref = std::string("winrt::Windows::Foundation::IReference<") + right_type + ">";
            for (auto&& field : left.fields)
            {
                if (right_type == field.second || right_as_ref == field.second)
                {
                    return true;
                }
            }

            return false;
        };

        for (size_t left = 0; left < structs.size(); ++left)
        {
            for (size_t right = left + 1; right < structs.size(); ++right)
            {
                if (depends(w, structs[left], structs[right]))
                {
                    // Left depends on right, therefore move right in front of left.
                    complex_struct temp = std::move(structs[right]);
                    structs.erase(structs.begin() + right);
                    structs.insert(structs.begin() + left, std::move(temp));

                    // Start over from the newly inserted struct.
                    right = structs.size();
                    --left;
                }
            }
        }

        bool promote = false;
        auto cpp_namespace = w.write_temp("@", w.type_namespace);

        for (auto&& type : structs)
        {
            auto name = type.type.TypeName();
            std::string_view is_noexcept = type.is_noexcept ? " noexcept" : "";

            w.write(format,
                name,
                bind_each<write_struct_field>(type.fields),
                name,
                name,
                is_noexcept,
                bind<write_struct_equality>(type.fields),
                name,
                name,
                is_noexcept);

            for (auto&& field : type.fields)
            {
                if (field.second.find(':') == std::string::npos)
                {
                    continue;
                }

                if (!starts_with(field.second, cpp_namespace))
                {
                    promote = true;
                }
            }
        }

        return promote;
    }